

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableStruct.cpp
# Opt level: O3

string * __thiscall
adios2::core::StructDefinition::Name_abi_cxx11_
          (string *__return_storage_ptr__,StructDefinition *this,size_t index)

{
  long lVar1;
  pointer pSVar2;
  ulong uVar3;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pSVar2 = (this->m_Definition).
           super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = ((long)(this->m_Definition).
                 super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar2 >> 3) *
          0x6db6db6db6db6db7;
  if (uVar3 < index || uVar3 - index == 0) {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"core","");
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"VariableStruct::StructDefinition","");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Name","");
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"invalid index","");
    helper::Throw<std::invalid_argument>(&local_b0,&local_50,&local_70,&local_90,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    pSVar2 = (this->m_Definition).
             super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  lVar1 = *(long *)&pSVar2[index].Name._M_dataplus;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,lVar1,pSVar2[index].Name._M_string_length + lVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string StructDefinition::Name(const size_t index) const
{
    if (index >= m_Definition.size())
    {
        helper::Throw<std::invalid_argument>("core", "VariableStruct::StructDefinition", "Name",
                                             "invalid index");
    }
    return m_Definition[index].Name;
}